

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteSwapper.h
# Opt level: O0

void Assimp::ByteSwap::Swap4(void *_szOut)

{
  uint8_t *szOut;
  void *_szOut_local;
  
  if (_szOut != (void *)0x0) {
    std::swap<unsigned_char>((uchar *)_szOut,(uchar *)((long)_szOut + 3));
    std::swap<unsigned_char>((uchar *)((long)_szOut + 1),(uchar *)((long)_szOut + 2));
    return;
  }
  __assert_fail("_szOut",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/include/assimp/ByteSwapper.h"
                ,0x5e,"static void Assimp::ByteSwap::Swap4(void *)");
}

Assistant:

static inline void Swap4(void* _szOut)
    {
        ai_assert(_szOut);

#if _MSC_VER >= 1400
        uint32_t* const szOut = reinterpret_cast<uint32_t*>(_szOut);
        *szOut = _byteswap_ulong(*szOut);
#else
        uint8_t* const szOut = reinterpret_cast<uint8_t*>(_szOut);
        std::swap(szOut[0],szOut[3]);
        std::swap(szOut[1],szOut[2]);
#endif
    }